

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.hpp
# Opt level: O0

void __thiscall
cs_function_invoker_impl::function_invoker<void(cs::numeric)>::operator()
          (function_invoker<void_(cs::numeric)> *this,int *args)

{
  numeric *in_stack_00000110;
  var *in_stack_00000118;
  int *in_stack_ffffffffffffffc8;
  var local_18 [3];
  
  cs_impl::type_convertor<int&,cs::numeric>::convert<int&>(in_stack_ffffffffffffffc8);
  cs::invoke<cs::numeric>(in_stack_00000118,in_stack_00000110);
  convert_helper<void>::get_val(local_18);
  cs_impl::any::~any((any *)0x12435b);
  return;
}

Assistant:

RetT operator()(ElementT &&...args) const
		{
			return convert_helper<RetT>::get_val(cs::invoke(m_func, cs_impl::type_convertor<ElementT, ArgsT>::convert(
			        std::forward<ElementT>(args))...));
		}